

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O0

bool __thiscall cmExportFileGenerator::GenerateImportFile(cmExportFileGenerator *this)

{
  auto_ptr<cmGeneratedFileStream> *this_00;
  byte bVar1;
  int iVar2;
  basic_ofstream<char,_std::char_traits<char>_> *pbVar3;
  char *pcVar4;
  cmGeneratedFileStream *pcVar5;
  ostream *poVar6;
  allocator local_229;
  undefined1 local_228 [6];
  bool result;
  basic_ofstream<char,_std::char_traits<char>_> *local_208;
  ostream *os;
  string local_1f8 [32];
  undefined1 local_1d8 [8];
  ostringstream e;
  string local_60 [8];
  string se;
  auto_ptr<cmGeneratedFileStream> ap_1;
  auto_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_> local_28;
  auto_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_> ap;
  auto_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_> foutPtr;
  cmExportFileGenerator *this_local;
  
  cmsys::auto_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>::auto_ptr
            (&ap,(basic_ofstream<char,_std::char_traits<char>_> *)0x0);
  if ((this->AppendMode & 1U) == 0) {
    pcVar5 = (cmGeneratedFileStream *)operator_new(0x248);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmGeneratedFileStream::cmGeneratedFileStream(pcVar5,pcVar4,true);
    this_00 = (auto_ptr<cmGeneratedFileStream> *)((long)&se.field_2 + 8);
    cmsys::auto_ptr<cmGeneratedFileStream>::auto_ptr(this_00,pcVar5);
    pcVar5 = cmsys::auto_ptr<cmGeneratedFileStream>::operator->(this_00);
    cmGeneratedFileStream::SetCopyIfDifferent(pcVar5,true);
    cmsys::auto_ptr<std::ofstream>::operator=
              ((auto_ptr<std::ofstream> *)&ap,
               (auto_ptr<cmGeneratedFileStream> *)((long)&se.field_2 + 8));
    cmsys::auto_ptr<cmGeneratedFileStream>::~auto_ptr
              ((auto_ptr<cmGeneratedFileStream> *)((long)&se.field_2 + 8));
  }
  else {
    pbVar3 = (basic_ofstream<char,_std::char_traits<char>_> *)operator_new(0x200);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::ofstream::ofstream(pbVar3,pcVar4,_S_app);
    cmsys::auto_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>::auto_ptr(&local_28,pbVar3)
    ;
    cmsys::auto_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>::operator=(&ap,&local_28);
    cmsys::auto_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>::~auto_ptr(&local_28);
  }
  pbVar3 = cmsys::auto_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>::get(&ap);
  if (pbVar3 != (basic_ofstream<char,_std::char_traits<char>_> *)0x0) {
    pbVar3 = cmsys::auto_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>::operator*(&ap);
    bVar1 = std::ios::operator!((ios *)((long)&(pbVar3->
                                               super_basic_ostream<char,_std::char_traits<char>_>).
                                               _vptr_basic_ostream +
                                       (long)(pbVar3->
                                             super_basic_ostream<char,_std::char_traits<char>_>).
                                             _vptr_basic_ostream[-3]));
    if ((bVar1 & 1) == 0) {
      local_208 = cmsys::auto_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>::operator*
                            (&ap);
      poVar6 = std::operator<<(&local_208->super_basic_ostream<char,_std::char_traits<char>_>,
                               "# Generated by CMake ");
      pcVar4 = cmVersion::GetCMakeVersion();
      poVar6 = std::operator<<(poVar6,pcVar4);
      std::operator<<(poVar6,"\n\n");
      poVar6 = std::operator<<(&local_208->super_basic_ostream<char,_std::char_traits<char>_>,
                               "if(\"${CMAKE_MAJOR_VERSION}.${CMAKE_MINOR_VERSION}\" LESS 2.5)\n");
      poVar6 = std::operator<<(poVar6,"   message(FATAL_ERROR \"CMake >= 2.6.0 required\")\n");
      std::operator<<(poVar6,"endif()\n");
      poVar6 = std::operator<<(&local_208->super_basic_ostream<char,_std::char_traits<char>_>,
                               "cmake_policy(PUSH)\n");
      std::operator<<(poVar6,"cmake_policy(VERSION 2.6)\n");
      pbVar3 = local_208;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_228,"",&local_229);
      GenerateImportHeaderCode
                (this,&pbVar3->super_basic_ostream<char,_std::char_traits<char>_>,
                 (string *)local_228);
      std::__cxx11::string::~string((string *)local_228);
      std::allocator<char>::~allocator((allocator<char> *)&local_229);
      iVar2 = (*this->_vptr_cmExportFileGenerator[2])(this,local_208);
      this_local._7_1_ = (bool)((byte)iVar2 & 1);
      GenerateImportFooterCode(this,&local_208->super_basic_ostream<char,_std::char_traits<char>_>);
      std::operator<<(&local_208->super_basic_ostream<char,_std::char_traits<char>_>,
                      "cmake_policy(POP)\n");
      os._4_4_ = 1;
      goto LAB_0058cc48;
    }
  }
  cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
  poVar6 = std::operator<<((ostream *)local_1d8,"cannot write to file \"");
  poVar6 = std::operator<<(poVar6,(string *)&this->MainImportFile);
  poVar6 = std::operator<<(poVar6,"\": ");
  std::operator<<(poVar6,local_60);
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmSystemTools::Error(pcVar4,(char *)0x0,(char *)0x0,(char *)0x0);
  std::__cxx11::string::~string(local_1f8);
  this_local._7_1_ = false;
  os._4_4_ = 1;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
  std::__cxx11::string::~string(local_60);
LAB_0058cc48:
  cmsys::auto_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>::~auto_ptr(&ap);
  return this_local._7_1_;
}

Assistant:

bool cmExportFileGenerator::GenerateImportFile()
{
  // Open the output file to generate it.
  cmsys::auto_ptr<cmsys::ofstream> foutPtr;
  if(this->AppendMode)
    {
    // Open for append.
    cmsys::auto_ptr<cmsys::ofstream>
      ap(new cmsys::ofstream(this->MainImportFile.c_str(), std::ios::app));
    foutPtr = ap;
    }
  else
    {
    // Generate atomically and with copy-if-different.
    cmsys::auto_ptr<cmGeneratedFileStream>
      ap(new cmGeneratedFileStream(this->MainImportFile.c_str(), true));
    ap->SetCopyIfDifferent(true);
    foutPtr = ap;
    }
  if(!foutPtr.get() || !*foutPtr)
    {
    std::string se = cmSystemTools::GetLastSystemError();
    std::ostringstream e;
    e << "cannot write to file \"" << this->MainImportFile
      << "\": " << se;
    cmSystemTools::Error(e.str().c_str());
    return false;
    }
  std::ostream& os = *foutPtr;

  // Protect that file against use with older CMake versions.
  os << "# Generated by CMake " << cmVersion::GetCMakeVersion() << "\n\n";
  os << "if(\"${CMAKE_MAJOR_VERSION}.${CMAKE_MINOR_VERSION}\" LESS 2.5)\n"
     << "   message(FATAL_ERROR \"CMake >= 2.6.0 required\")\n"
     << "endif()\n";

  // Isolate the file policy level.
  // We use 2.6 here instead of the current version because newer
  // versions of CMake should be able to export files imported by 2.6
  // until the import format changes.
  os << "cmake_policy(PUSH)\n"
     << "cmake_policy(VERSION 2.6)\n";

  // Start with the import file header.
  this->GenerateImportHeaderCode(os);

  // Create all the imported targets.
  bool result = this->GenerateMainFile(os);

  // End with the import file footer.
  this->GenerateImportFooterCode(os);
  os << "cmake_policy(POP)\n";

  return result;
}